

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O3

void __thiscall hwnet::util::TimerMgr::~TimerMgr(TimerMgr *this)

{
  _Manager_type p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  pointer ppTVar3;
  ulong uVar4;
  Timer *pTVar5;
  
  if (this->elements_size != 0) {
    uVar4 = 0;
    do {
      pTVar5 = (this->elements).
               super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar4];
      p_Var1 = (pTVar5->mCallback).super__Function_base._M_manager;
      if (p_Var1 != (_Manager_type)0x0) {
        (*p_Var1)((_Any_data *)&pTVar5->mCallback,(_Any_data *)&pTVar5->mCallback,__destroy_functor)
        ;
        (pTVar5->mCallback).super__Function_base._M_manager = (_Manager_type)0x0;
        (pTVar5->mCallback)._M_invoker = (_Invoker_type)0x0;
        pTVar5 = (this->elements).
                 super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar4];
      }
      p_Var2 = (pTVar5->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (pTVar5->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pTVar5->selfPtr).super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < this->elements_size);
  }
  ppTVar3 = (this->elements).
            super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar3 != (pointer)0x0) {
    operator_delete(ppTVar3,(long)(this->elements).
                                  super__Vector_base<hwnet::util::Timer_*,_std::allocator<hwnet::util::Timer_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar3
                   );
  }
  p_Var2 = (this->empty_element_ptr).
           super___shared_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    return;
  }
  return;
}

Assistant:

~TimerMgr(){
		for(size_t i = 0; i < this->elements_size;i++) {
			this->elements[i]->mCallback = nullptr;
			this->elements[i]->selfPtr = nullptr;
		}
	}